

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall SPTest_ConWithRandomVar_Test::TestBody(SPTest_ConWithRandomVar_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BasicProblem<mp::BasicProblemParams<int>_> *this_00;
  SPAdapter *expected_expression;
  int iVar4;
  int iVar5;
  int iVar6;
  MutAlgebraicCon MVar7;
  LinearConHandler LVar8;
  Stage SVar9;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  SPAdapter sp;
  LinearConHandler expr;
  ColumnSizeHandler cols;
  TestProblem p;
  NLHeader header;
  undefined4 in_stack_fffffffffffff718;
  int in_stack_fffffffffffff71c;
  TestProblem *in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff728;
  int in_stack_fffffffffffff72c;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  NLHeader *in_stack_fffffffffffff738;
  int line;
  TestProblem *in_stack_fffffffffffff740;
  Type in_stack_fffffffffffff74c;
  Type type;
  undefined4 in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff754;
  undefined4 in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff76c;
  undefined4 in_stack_fffffffffffff798;
  double in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff7e0;
  AssertionResult local_808 [2];
  SPAdapter *local_7e8;
  int local_7e0;
  SPAdapter *local_7d8;
  int local_7d0;
  int local_7c8;
  undefined4 local_7c4;
  AssertionResult local_7c0 [2];
  int local_7a0;
  undefined4 local_79c;
  AssertionResult local_798;
  ColProblem *in_stack_fffffffffffff878;
  SPAdapter *in_stack_fffffffffffff880;
  AssertionResult local_770;
  SPAdapter local_760;
  ColProblem *local_518;
  int local_510;
  ColProblem *local_508;
  int local_500;
  ColProblem *local_4f8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4f0;
  int local_4e8;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_4e0;
  undefined8 local_a0;
  
  MakeHeader((int)((ulong)in_stack_fffffffffffff720 >> 0x20),(int)in_stack_fffffffffffff720);
  local_a0 = 1;
  TestProblem::TestProblem(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  local_4e0.super_ExprBase.impl_ =
       (ExprBase)
       TestProblem::MakeTestRV
                 ((TestProblem *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
  MVar7 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    (in_stack_fffffffffffff7e0,
                     (double)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                     in_stack_fffffffffffff7d0);
  this_00 = MVar7.
            super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar4 = MVar7.
          super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_4f0 = this_00;
  local_4e8 = iVar4;
  local_4f8 = (ColProblem *)
              TestProblem::OnColumnSizes
                        ((TestProblem *)
                         CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  mp::ColProblemBuilder::ColumnSizeHandler::Add
            ((ColumnSizeHandler *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  LVar8 = TestProblem::OnLinearConExpr
                    ((TestProblem *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                     in_stack_fffffffffffff72c);
  local_518 = LVar8.problem_;
  local_510 = LVar8.con_index_;
  local_508 = local_518;
  local_500 = local_510;
  mp::ColProblemBuilder::LinearConHandler::AddTerm
            ((LinearConHandler *)in_stack_fffffffffffff740,
             (int)((ulong)in_stack_fffffffffffff738 >> 0x20),
             (double)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  mp::SPAdapter::SPAdapter(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  mp::SPAdapter::num_cons((SPAdapter *)0x1226fa);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff738,
             (char *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             (int *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
             (int *)in_stack_fffffffffffff720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_770);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
    testing::AssertionResult::failure_message((AssertionResult *)0x1227c1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
               in_stack_fffffffffffff74c,(char *)in_stack_fffffffffffff740,
               (int)((ulong)in_stack_fffffffffffff738 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)CONCAT44(iVar4,in_stack_fffffffffffff798));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff720);
    testing::Message::~Message((Message *)0x12281e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122876);
  local_79c = 2;
  local_7a0 = mp::SPAdapter::num_stages(&local_760);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)in_stack_fffffffffffff738,
             (char *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             (int *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
             (int *)in_stack_fffffffffffff720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_798);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
    testing::AssertionResult::failure_message((AssertionResult *)0x122935);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
               in_stack_fffffffffffff74c,(char *)in_stack_fffffffffffff740,
               (int)((ulong)in_stack_fffffffffffff738 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)CONCAT44(iVar4,in_stack_fffffffffffff798));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff720);
    testing::Message::~Message((Message *)0x122992);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1229ea);
  local_7c4 = 0;
  SVar9 = mp::SPAdapter::stage((SPAdapter *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  local_7e8 = SVar9.adapter_;
  iVar5 = SVar9.index_;
  local_7e0 = iVar5;
  local_7d8 = local_7e8;
  local_7d0 = iVar5;
  iVar2 = mp::SPAdapter::Stage::num_cons((Stage *)0x122a52);
  local_7c8 = iVar2;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)in_stack_fffffffffffff738,
             (char *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             (int *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
             (int *)in_stack_fffffffffffff720,
             (type *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  iVar3 = (int)((ulong)in_stack_fffffffffffff738 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7c0);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff74c);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar5,iVar2));
    in_stack_fffffffffffff740 =
         (TestProblem *)testing::AssertionResult::failure_message((AssertionResult *)0x122afe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar5,iVar2),type,(char *)in_stack_fffffffffffff740,iVar3,
               (char *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)CONCAT44(iVar4,in_stack_fffffffffffff798));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff720);
    testing::Message::~Message((Message *)0x122b5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122bb3);
  SVar9 = mp::SPAdapter::stage((SPAdapter *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  expected_expression = SVar9.adapter_;
  iVar6 = SVar9.index_;
  iVar3 = mp::SPAdapter::Stage::num_cons((Stage *)0x122c1e);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)expected_expression,(char *)CONCAT44(iVar6,iVar3),
             (int *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
             (int *)in_stack_fffffffffffff720);
  line = (int)((ulong)expected_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_808);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar5,iVar2));
    in_stack_fffffffffffff720 =
         (TestProblem *)testing::AssertionResult::failure_message((AssertionResult *)0x122cc5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar5,iVar2),type,(char *)in_stack_fffffffffffff740,line,
               (char *)CONCAT44(iVar6,iVar3));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)CONCAT44(iVar4,in_stack_fffffffffffff798));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff720);
    testing::Message::~Message((Message *)0x122d22);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x122d77);
  mp::SPAdapter::~SPAdapter((SPAdapter *)in_stack_fffffffffffff720);
  TestProblem::~TestProblem(in_stack_fffffffffffff720);
  return;
}

Assistant:

TEST(SPTest, ConWithRandomVar) {
  // Test that constraint that contains a random var belongs at least to
  // the second stage.
  auto header = MakeHeader(1);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0);
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  auto expr = p.OnLinearConExpr(0);
  expr.AddTerm(0, 1);
  mp::SPAdapter sp(p);
  EXPECT_EQ(1, sp.num_cons());
  EXPECT_EQ(2, sp.num_stages());
  EXPECT_EQ(0, sp.stage(0).num_cons());
  EXPECT_EQ(1, sp.stage(1).num_cons());
}